

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O1

void search::movegen::addPawnMove(int from,int to,int cap,int side,MoveList *list,Board *pos)

{
  pointer *ppMVar1;
  iterator iVar2;
  uint uVar3;
  long lVar4;
  Move local_38;
  
  uVar3 = cap << 0xe | to << 7;
  if (board::Board::RANKS[board::Board::SQ64[from]] == *(int *)((long)&PAWN_RANK + (long)side * 4))
  {
    uVar3 = uVar3 | from;
    lVar4 = 0;
    do {
      local_38.value = *(int *)(PROMOTION_PIECES + (long)side * 0x10 + lVar4 * 4) << 0x14 | uVar3;
      local_38.score =
           *(int *)(MVVLVA_SCORES +
                   (long)pos->board[from & 0x7f] * 4 + (ulong)((uVar3 & 0x3c000) >> 0xe) * 0x34) +
           1000000;
      iVar2._M_current =
           (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<board::Move,std::allocator<board::Move>>::_M_realloc_insert<board::Move_const&>
                  ((vector<board::Move,std::allocator<board::Move>> *)list,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        ppMVar1 = &(list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else {
    local_38.value = uVar3 | from;
    local_38.score =
         *(int *)(MVVLVA_SCORES +
                 (long)pos->board[from & 0x7f] * 4 + (ulong)(local_38.value >> 0xe & 0xf) * 0x34) +
         1000000;
    iVar2._M_current =
         (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<board::Move,std::allocator<board::Move>>::_M_realloc_insert<board::Move_const&>
                ((vector<board::Move,std::allocator<board::Move>> *)list,iVar2,&local_38);
    }
    else {
      *iVar2._M_current = local_38;
      ppMVar1 = &(list->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
  return;
}

Assistant:

inline void search::movegen::addPawnMove(const int from, const int to, const int cap, const int side, MoveList& list,
                                         board::Board& pos)
{
    if (board::Board::RANKS[board::Board::SQ64[from]] == PAWN_RANK[side]) {
        for (int i = 0; i < 4; i++) {
            addCaptureMove(board::Move::MOVE(from, to, cap, PROMOTION_PIECES[side][i], 0), list, pos);
        }
    }
    else {
        addCaptureMove(board::Move::MOVE(from, to, cap, board::EMPTY, 0), list, pos);
    }
}